

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O0

int Fl_Text_Editor::kf_default(int c,Fl_Text_Editor *e)

{
  int iVar1;
  Fl_When FVar2;
  char local_1a [2];
  Fl_Text_Editor *pFStack_18;
  char s [2];
  Fl_Text_Editor *e_local;
  int c_local;
  
  if ((c != 0) && ((pFStack_18 = e, iVar1 = isprint(c), iVar1 != 0 || (c == 9)))) {
    memset(local_1a,0,2);
    local_1a[0] = (char)c;
    kill_selection(pFStack_18);
    iVar1 = insert_mode(pFStack_18);
    if (iVar1 == 0) {
      Fl_Text_Display::overstrike(&pFStack_18->super_Fl_Text_Display,local_1a);
    }
    else {
      Fl_Text_Display::insert(&pFStack_18->super_Fl_Text_Display,local_1a);
    }
    Fl_Text_Display::show_insert_position(&pFStack_18->super_Fl_Text_Display);
    Fl_Widget::set_changed((Fl_Widget *)pFStack_18);
    FVar2 = Fl_Widget::when((Fl_Widget *)pFStack_18);
    if ((FVar2 & FL_WHEN_CHANGED) != FL_WHEN_NEVER) {
      Fl_Widget::do_callback((Fl_Widget *)pFStack_18);
    }
    return 1;
  }
  return 0;
}

Assistant:

int Fl_Text_Editor::kf_default(int c, Fl_Text_Editor* e) {
  // FIXME: this function is a mess! Fix this!
  if (!c || (!isprint(c) && c != '\t')) return 0;
  char s[2] = "\0";
  s[0] = (char)c;
  kill_selection(e);
  if (e->insert_mode()) e->insert(s);
  else e->overstrike(s);
  e->show_insert_position();
  e->set_changed();
  if (e->when()&FL_WHEN_CHANGED) e->do_callback();
  return 1;
}